

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,_testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest6,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest7,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest8,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest9,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest10,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest11,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  undefined1 uVar5;
  CodeLocation *pCVar6;
  ostream *poVar7;
  TestFactoryBase *pTVar8;
  internal *piVar9;
  CodeLocation *code_location_00;
  int iVar10;
  char *case_name_00;
  char *str;
  char *str_00;
  char *str_01;
  char *str_02;
  char *str_03;
  char *str_04;
  char *str_05;
  char *str_06;
  char *str_07;
  char *str_08;
  char *str_09;
  char *str_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  FILE *pFVar11;
  GTestLog local_4c4;
  TypedTestSuitePState *local_4c0;
  allocator<char> local_4b1;
  CodeLocation local_4b0;
  CodeLocation local_488;
  CodeLocation local_460;
  CodeLocation local_438;
  string *local_410;
  string *local_408;
  string *local_400;
  CodeLocation local_3f8;
  string local_3d0;
  CodeLocation local_3b0;
  string local_388;
  CodeLocation local_368;
  CodeLocation local_340;
  string local_318;
  string local_2f8;
  CodeLocation local_2d8;
  CodeLocation local_2b0;
  CodeLocation local_288;
  string local_260;
  string local_240;
  string test_name;
  CodeLocation local_200;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  string test_name_4;
  string test_name_5;
  char *local_138 [4];
  CodeLocation local_118;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar10 = (int)case_name;
  local_4c0 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
  GetPrefixUntilComma_abi_cxx11_(&local_50,(internal *)code_location,str);
  StripTrailingSpaces(&test_name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = TypedTestSuitePState::TestExists
                    ((TypedTestSuitePState *)
                     bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                     &test_name);
  pFVar11 = _stderr;
  if (bVar4) {
    pCVar6 = TypedTestSuitePState::GetCodeLocation
                       ((TypedTestSuitePState *)
                        bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                        &test_name);
    CodeLocation::CodeLocation(&local_200,pCVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"PathBuilder",(allocator<char> *)&local_288);
    std::operator+(&local_438.file,&local_368.file,"/");
    std::operator+(&local_3f8.file,&local_438.file,"PkitsTest06VerifyingBasicConstraints");
    std::operator+(&local_488.file,&local_3f8.file,"/");
    std::operator+(&local_460.file,&local_488.file,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_4c0)
    ;
    GetPrefixUntilComma_abi_cxx11_(&local_2d8.file,(internal *)code_location,str_00);
    StripTrailingSpaces(&local_3b0.file,&local_2d8.file);
    _Var1._M_p = local_3b0.file._M_dataplus._M_p;
    GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
    _Var2._M_p = local_340.file._M_dataplus._M_p;
    CodeLocation::CodeLocation(&local_4b0,&local_200);
    iVar10 = local_200.line;
    _Var3._M_p = local_200.file._M_dataplus._M_p;
    bVar4 = IsTrue(true);
    if (!bVar4) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Condition !test_case_fp || !test_suite_fp failed. ");
      poVar7 = std::operator<<(poVar7,
                               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                              );
      poVar7 = std::operator<<(poVar7,_Var3._M_p);
      poVar7 = std::operator<<(poVar7,":");
      std::ostream::operator<<(poVar7,iVar10);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    bVar4 = IsTrue(true);
    if (!bVar4) {
      GTestLog::GTestLog((GTestLog *)&local_2b0,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Condition !test_case_fp || !test_suite_fp failed. ");
      poVar7 = std::operator<<(poVar7,
                               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                              );
      poVar7 = std::operator<<(poVar7,local_200.file._M_dataplus._M_p);
      poVar7 = std::operator<<(poVar7,":");
      std::ostream::operator<<(poVar7,local_200.line);
      GTestLog::~GTestLog((GTestLog *)&local_2b0);
    }
    pTVar8 = (TestFactoryBase *)operator_new(8);
    pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a1c80;
    iVar10 = 0;
    MakeAndRegisterTestInfo
              (&local_460.file,_Var1._M_p,_Var2._M_p,(char *)0x0,&local_4b0,
               &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_368);
    CodeLocation::CodeLocation(&local_488,&local_200);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_200);
    CodeLocation::CodeLocation(&local_118,(CodeLocation *)prefix);
    piVar9 = (internal *)SkipComma((char *)code_location);
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
    GetPrefixUntilComma_abi_cxx11_(&local_f0,piVar9,str_01);
    StripTrailingSpaces(&test_name_1,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    bVar4 = TypedTestSuitePState::TestExists
                      ((TypedTestSuitePState *)
                       bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                       &test_name_1);
    pFVar11 = _stderr;
    if (bVar4) {
      pCVar6 = TypedTestSuitePState::GetCodeLocation
                         ((TypedTestSuitePState *)
                          bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_
                          ,&test_name_1);
      CodeLocation::CodeLocation(&local_2b0,pCVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"PathBuilder",(allocator<char> *)&local_388);
      std::operator+(&local_438.file,&local_368.file,"/");
      std::operator+(&local_3f8.file,&local_438.file,"PkitsTest06VerifyingBasicConstraints");
      std::operator+(&local_488.file,&local_3f8.file,"/");
      std::operator+(&local_460.file,&local_488.file,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      local_4c0);
      GetPrefixUntilComma_abi_cxx11_(&local_2d8.file,piVar9,str_02);
      StripTrailingSpaces(&local_3b0.file,&local_2d8.file);
      _Var1._M_p = local_3b0.file._M_dataplus._M_p;
      GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
      _Var2._M_p = local_340.file._M_dataplus._M_p;
      CodeLocation::CodeLocation(&local_4b0,&local_2b0);
      iVar10 = local_2b0.line;
      _Var3._M_p = local_2b0.file._M_dataplus._M_p;
      bVar4 = IsTrue(true);
      if (!bVar4) {
        GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Condition !test_case_fp || !test_suite_fp failed. ");
        poVar7 = std::operator<<(poVar7,
                                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                );
        poVar7 = std::operator<<(poVar7,_Var3._M_p);
        poVar7 = std::operator<<(poVar7,":");
        std::ostream::operator<<(poVar7,iVar10);
        GTestLog::~GTestLog((GTestLog *)&local_288);
      }
      bVar4 = IsTrue(true);
      if (!bVar4) {
        GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Condition !test_case_fp || !test_suite_fp failed. ");
        poVar7 = std::operator<<(poVar7,
                                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                );
        poVar7 = std::operator<<(poVar7,local_2b0.file._M_dataplus._M_p);
        poVar7 = std::operator<<(poVar7,":");
        std::ostream::operator<<(poVar7,local_2b0.line);
        GTestLog::~GTestLog((GTestLog *)&local_288);
      }
      pTVar8 = (TestFactoryBase *)operator_new(8);
      pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a1d58;
      iVar10 = 0;
      MakeAndRegisterTestInfo
                (&local_460.file,_Var1._M_p,_Var2._M_p,(char *)0x0,&local_4b0,
                 &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_368);
      CodeLocation::CodeLocation(&local_488,&local_2b0);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_2b0);
      CodeLocation::CodeLocation(&local_288,&local_118);
      piVar9 = (internal *)SkipComma((char *)piVar9);
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
      GetPrefixUntilComma_abi_cxx11_(&local_d0,piVar9,str_03);
      StripTrailingSpaces(&test_name_2,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar4 = TypedTestSuitePState::TestExists
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                         &test_name_2);
      pFVar11 = _stderr;
      if (bVar4) {
        local_400 = &test_name_2;
        pCVar6 = TypedTestSuitePState::GetCodeLocation
                           ((TypedTestSuitePState *)
                            bssl::
                            gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                            local_400);
        CodeLocation::CodeLocation(&local_2d8,pCVar6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"PathBuilder",(allocator<char> *)&local_2f8);
        std::operator+(&local_438.file,&local_368.file,"/");
        std::operator+(&local_3f8.file,&local_438.file,"PkitsTest06VerifyingBasicConstraints");
        std::operator+(&local_488.file,&local_3f8.file,"/");
        std::operator+(&local_460.file,&local_488.file,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        local_4c0);
        GetPrefixUntilComma_abi_cxx11_(&local_340.file,piVar9,str_04);
        StripTrailingSpaces(&local_3b0.file,&local_340.file);
        _Var1._M_p = local_3b0.file._M_dataplus._M_p;
        GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
        _Var2._M_p = local_388._M_dataplus._M_p;
        CodeLocation::CodeLocation(&local_4b0,&local_2d8);
        iVar10 = local_2d8.line;
        _Var3._M_p = local_2d8.file._M_dataplus._M_p;
        bVar4 = IsTrue(true);
        if (!bVar4) {
          GTestLog::GTestLog((GTestLog *)&local_3d0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                  );
          poVar7 = std::operator<<(poVar7,_Var3._M_p);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,iVar10);
          GTestLog::~GTestLog((GTestLog *)&local_3d0);
        }
        bVar4 = IsTrue(true);
        if (!bVar4) {
          GTestLog::GTestLog((GTestLog *)&local_3d0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                  );
          poVar7 = std::operator<<(poVar7,local_2d8.file._M_dataplus._M_p);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_2d8.line);
          GTestLog::~GTestLog((GTestLog *)&local_3d0);
        }
        pTVar8 = (TestFactoryBase *)operator_new(8);
        pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a1e08;
        iVar10 = 0;
        MakeAndRegisterTestInfo
                  (&local_460.file,_Var1._M_p,_Var2._M_p,(char *)0x0,&local_4b0,
                   &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_368);
        CodeLocation::CodeLocation(&local_488,&local_2d8);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_2d8);
        CodeLocation::CodeLocation(&local_340,&local_288);
        piVar9 = (internal *)SkipComma((char *)piVar9);
        RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
        GetPrefixUntilComma_abi_cxx11_(&local_b0,piVar9,str_05);
        StripTrailingSpaces(&test_name_3,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar4 = TypedTestSuitePState::TestExists
                          ((TypedTestSuitePState *)
                           bssl::
                           gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                           &test_name_3);
        pFVar11 = _stderr;
        if (bVar4) {
          local_408 = &test_name_3;
          pCVar6 = TypedTestSuitePState::GetCodeLocation
                             ((TypedTestSuitePState *)
                              bssl::
                              gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                              local_408);
          CodeLocation::CodeLocation(&local_368,pCVar6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,"PathBuilder",(allocator<char> *)&local_240);
          std::operator+(&local_438.file,&local_3b0.file,"/");
          std::operator+(&local_3f8.file,&local_438.file,"PkitsTest06VerifyingBasicConstraints");
          std::operator+(&local_488.file,&local_3f8.file,"/");
          std::operator+(&local_460.file,&local_488.file,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          local_4c0);
          GetPrefixUntilComma_abi_cxx11_(&local_3d0,piVar9,str_06);
          StripTrailingSpaces(&local_388,&local_3d0);
          GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
          _Var2._M_p = local_2f8._M_dataplus._M_p;
          CodeLocation::CodeLocation(&local_4b0,&local_368);
          iVar10 = local_368.line;
          _Var1._M_p = local_368.file._M_dataplus._M_p;
          bVar4 = IsTrue(true);
          if (!bVar4) {
            GTestLog::GTestLog((GTestLog *)&local_318,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                               ,0x201);
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "Condition !test_case_fp || !test_suite_fp failed. ");
            poVar7 = std::operator<<(poVar7,
                                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                    );
            poVar7 = std::operator<<(poVar7,_Var1._M_p);
            poVar7 = std::operator<<(poVar7,":");
            std::ostream::operator<<(poVar7,iVar10);
            GTestLog::~GTestLog((GTestLog *)&local_318);
          }
          bVar4 = IsTrue(true);
          if (!bVar4) {
            GTestLog::GTestLog((GTestLog *)&local_318,GTEST_FATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                               ,0x216);
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "Condition !test_case_fp || !test_suite_fp failed. ");
            poVar7 = std::operator<<(poVar7,
                                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                    );
            poVar7 = std::operator<<(poVar7,local_368.file._M_dataplus._M_p);
            poVar7 = std::operator<<(poVar7,":");
            std::ostream::operator<<(poVar7,local_368.line);
            GTestLog::~GTestLog((GTestLog *)&local_318);
          }
          pTVar8 = (TestFactoryBase *)operator_new(8);
          pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a1eb8;
          iVar10 = 0;
          MakeAndRegisterTestInfo
                    (&local_460.file,local_388._M_dataplus._M_p,_Var2._M_p,(char *)0x0,&local_4b0,
                     &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                      ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_3b0);
          CodeLocation::CodeLocation(&local_488,&local_368);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::~string((string *)&local_368);
          CodeLocation::CodeLocation(&local_3b0,&local_340);
          piVar9 = (internal *)SkipComma((char *)piVar9);
          RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
          GetPrefixUntilComma_abi_cxx11_(&local_90,piVar9,str_07);
          StripTrailingSpaces(&test_name_4,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar4 = TypedTestSuitePState::TestExists
                            ((TypedTestSuitePState *)
                             bssl::
                             gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                             &test_name_4);
          pFVar11 = _stderr;
          if (bVar4) {
            local_410 = &test_name_4;
            pCVar6 = TypedTestSuitePState::GetCodeLocation
                               ((TypedTestSuitePState *)
                                bssl::
                                gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_
                                ,local_410);
            CodeLocation::CodeLocation(&local_3f8,pCVar6);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d0,"PathBuilder",(allocator<char> *)local_138);
            std::operator+(&local_388,&local_3d0,"/");
            std::operator+(&local_438.file,&local_388,"PkitsTest06VerifyingBasicConstraints");
            std::operator+(&local_488.file,&local_438.file,"/");
            std::operator+(&local_460.file,&local_488.file,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            local_4c0);
            GetPrefixUntilComma_abi_cxx11_(&local_318,piVar9,str_08);
            StripTrailingSpaces(&local_2f8,&local_318);
            GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
            _Var2._M_p = local_240._M_dataplus._M_p;
            CodeLocation::CodeLocation(&local_4b0,&local_3f8);
            iVar10 = local_3f8.line;
            _Var1._M_p = local_3f8.file._M_dataplus._M_p;
            bVar4 = IsTrue(true);
            if (!bVar4) {
              GTestLog::GTestLog((GTestLog *)&local_260,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x201);
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "Condition !test_case_fp || !test_suite_fp failed. ");
              poVar7 = std::operator<<(poVar7,
                                       "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                      );
              poVar7 = std::operator<<(poVar7,_Var1._M_p);
              poVar7 = std::operator<<(poVar7,":");
              std::ostream::operator<<(poVar7,iVar10);
              GTestLog::~GTestLog((GTestLog *)&local_260);
            }
            bVar4 = IsTrue(true);
            if (!bVar4) {
              GTestLog::GTestLog((GTestLog *)&local_260,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x216);
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "Condition !test_case_fp || !test_suite_fp failed. ");
              poVar7 = std::operator<<(poVar7,
                                       "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                      );
              poVar7 = std::operator<<(poVar7,local_3f8.file._M_dataplus._M_p);
              poVar7 = std::operator<<(poVar7,":");
              std::ostream::operator<<(poVar7,local_3f8.line);
              GTestLog::~GTestLog((GTestLog *)&local_260);
            }
            pTVar8 = (TestFactoryBase *)operator_new(8);
            pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a1f78;
            iVar10 = 0;
            MakeAndRegisterTestInfo
                      (&local_460.file,local_2f8._M_dataplus._M_p,_Var2._M_p,(char *)0x0,&local_4b0,
                       &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                        ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_318);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_388);
            std::__cxx11::string::~string((string *)&local_3d0);
            CodeLocation::CodeLocation(&local_488,&local_3f8);
            std::__cxx11::string::~string((string *)&local_488);
            std::__cxx11::string::~string((string *)&local_3f8);
            CodeLocation::CodeLocation(&local_438,&local_3b0);
            piVar9 = (internal *)SkipComma((char *)piVar9);
            RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest06VerifyingBasicConstraints");
            GetPrefixUntilComma_abi_cxx11_(&local_70,piVar9,str_09);
            StripTrailingSpaces(&test_name_5,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            bVar4 = TypedTestSuitePState::TestExists
                              ((TypedTestSuitePState *)
                               bssl::
                               gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_,
                               &test_name_5);
            pFVar11 = _stderr;
            if (bVar4) {
              pCVar6 = TypedTestSuitePState::GetCodeLocation
                                 ((TypedTestSuitePState *)
                                  bssl::
                                  gtest_typed_test_suite_p_state_PkitsTest06VerifyingBasicConstraints_
                                  ,&test_name_5);
              CodeLocation::CodeLocation(&local_460,pCVar6);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_318,"PathBuilder",&local_4b1);
              std::operator+(&local_2f8,&local_318,"/");
              std::operator+(&local_3d0,&local_2f8,"PkitsTest06VerifyingBasicConstraints");
              std::operator+(&local_488.file,&local_3d0,"/");
              std::operator+(&local_388,&local_488.file,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              local_4c0);
              GetPrefixUntilComma_abi_cxx11_(&local_260,piVar9,str_10);
              StripTrailingSpaces(&local_240,&local_260);
              GetTypeName<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>();
              CodeLocation::CodeLocation(&local_4b0,&local_460);
              iVar10 = local_460.line;
              _Var1._M_p = local_460.file._M_dataplus._M_p;
              bVar4 = IsTrue(true);
              if (!bVar4) {
                GTestLog::GTestLog(&local_4c4,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                poVar7 = std::operator<<((ostream *)&std::cerr,
                                         "Condition !test_case_fp || !test_suite_fp failed. ");
                poVar7 = std::operator<<(poVar7,
                                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                        );
                poVar7 = std::operator<<(poVar7,_Var1._M_p);
                poVar7 = std::operator<<(poVar7,":");
                std::ostream::operator<<(poVar7,iVar10);
                GTestLog::~GTestLog(&local_4c4);
              }
              bVar4 = IsTrue(true);
              if (!bVar4) {
                GTestLog::GTestLog(&local_4c4,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                poVar7 = std::operator<<((ostream *)&std::cerr,
                                         "Condition !test_case_fp || !test_suite_fp failed. ");
                poVar7 = std::operator<<(poVar7,
                                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                        );
                poVar7 = std::operator<<(poVar7,local_460.file._M_dataplus._M_p);
                poVar7 = std::operator<<(poVar7,":");
                std::ostream::operator<<(poVar7,local_460.line);
                GTestLog::~GTestLog(&local_4c4);
              }
              pTVar8 = (TestFactoryBase *)operator_new(8);
              pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_005a2060;
              type_names_00 =
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                       ::dummy_;
              pCVar6 = &local_4b0;
              case_name_00 = (char *)0x0;
              MakeAndRegisterTestInfo
                        (&local_388,local_240._M_dataplus._M_p,local_138[0],(char *)0x0,pCVar6,
                         &TypeIdHelper<bssl::PkitsTest06VerifyingBasicConstraints<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                          ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::~string((string *)local_138);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::string::~string((string *)&local_260);
              std::__cxx11::string::~string((string *)&local_388);
              std::__cxx11::string::~string((string *)&local_488);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::__cxx11::string::~string((string *)&local_2f8);
              std::__cxx11::string::~string((string *)&local_318);
              CodeLocation::CodeLocation(&local_488,&local_460);
              std::__cxx11::string::~string((string *)&local_488);
              std::__cxx11::string::~string((string *)&local_460);
              CodeLocation::CodeLocation(&local_4b0,&local_438);
              code_location_00 = (CodeLocation *)SkipComma((char *)piVar9);
              TypeParameterizedTestSuite<bssl::PkitsTest06VerifyingBasicConstraints,_testing::internal::Templates<bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidpathLenConstraintTest12,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest13,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidpathLenConstraintTest14,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest15,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6InvalidSelfIssuedpathLenConstraintTest16,_bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::Section6ValidSelfIssuedpathLenConstraintTest17>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>_>
              ::Register((char *)&local_4b0,code_location_00,local_4c0,case_name_00,(char *)pCVar6,
                         type_names_00);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::~string((string *)&test_name_5);
              std::__cxx11::string::~string((string *)&local_438);
              std::__cxx11::string::~string((string *)&test_name_4);
              std::__cxx11::string::~string((string *)&local_3b0);
              std::__cxx11::string::~string((string *)&test_name_3);
              std::__cxx11::string::~string((string *)&local_340);
              std::__cxx11::string::~string((string *)&test_name_2);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&test_name_1);
              std::__cxx11::string::~string((string *)&local_118);
              uVar5 = std::__cxx11::string::~string((string *)&test_name);
              return (bool)uVar5;
            }
            FormatFileLocation_abi_cxx11_
                      (&local_4b0.file,(internal *)local_438.file._M_dataplus._M_p,
                       (char *)(ulong)(uint)local_438.line,iVar10);
            goto LAB_0027124d;
          }
          local_410 = &test_name_4;
          FormatFileLocation_abi_cxx11_
                    (&local_4b0.file,(internal *)local_3b0.file._M_dataplus._M_p,
                     (char *)(ulong)(uint)local_3b0.line,iVar10);
        }
        else {
          local_408 = &test_name_3;
          FormatFileLocation_abi_cxx11_
                    (&local_4b0.file,(internal *)local_340.file._M_dataplus._M_p,
                     (char *)(ulong)(uint)local_340.line,iVar10);
          test_name_4._M_dataplus = test_name_3._M_dataplus;
        }
      }
      else {
        local_400 = &test_name_2;
        FormatFileLocation_abi_cxx11_
                  (&local_4b0.file,(internal *)local_288.file._M_dataplus._M_p,
                   (char *)(ulong)(uint)local_288.line,iVar10);
        test_name_4._M_dataplus = test_name_2._M_dataplus;
      }
    }
    else {
      FormatFileLocation_abi_cxx11_
                (&local_4b0.file,(internal *)local_118.file._M_dataplus._M_p,
                 (char *)(ulong)(uint)local_118.line,iVar10);
      test_name_4._M_dataplus = test_name_1._M_dataplus;
    }
    fprintf(pFVar11,"Failed to get code location for test %s.%s at %s.",
            "PkitsTest06VerifyingBasicConstraints",test_name_4._M_dataplus._M_p,
            local_4b0.file._M_dataplus._M_p);
  }
  else {
    FormatFileLocation_abi_cxx11_
              (&local_4b0.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),iVar10);
    test_name_5._M_dataplus = test_name._M_dataplus;
LAB_0027124d:
    fprintf(pFVar11,"Failed to get code location for test %s.%s at %s.",
            "PkitsTest06VerifyingBasicConstraints",test_name_5._M_dataplus._M_p,
            local_4b0.file._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_4b0);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }